

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeSet::UnicodeSet(UnicodeSet *this,UnicodeString *pattern,UErrorCode *status)

{
  UChar32 *pUVar1;
  
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_003c00a0;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_003c01b8;
  this->len = 0;
  this->capacity = 0x10;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  *(undefined8 *)((long)&this->strings + 1) = 0;
  *(undefined8 *)((long)&this->stringSpan + 1) = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar1 = (UChar32 *)uprv_malloc_63(0x40);
    this->list = pUVar1;
    if (pUVar1 == (UChar32 *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      allocateStrings(this,status);
      applyPattern(this,pattern,status);
    }
  }
  return;
}

Assistant:

UnicodeSet::UnicodeSet(const UnicodeString& pattern,
                       UErrorCode& status) :
    len(0), capacity(START_EXTRA), list(0), bmpSet(0), buffer(0),
    bufferCapacity(0), patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0)
{
    if(U_SUCCESS(status)){
        list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
        /* test for NULL */
        if(list == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;  
        }else{
            allocateStrings(status);
            applyPattern(pattern, status);
        }
    }
    _dbgct(this);
}